

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::PersistentColumnData::DeserializeField
          (PersistentColumnData *this,Deserializer *deserializer,field_id_t field_idx,
          char *field_name,LogicalType *type)

{
  PersistentColumnData PStack_68;
  
  ::std::
  deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
  ::emplace_back<duckdb::LogicalType_const&>
            ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
              *)&(deserializer->data).types,type);
  Deserializer::ReadProperty<duckdb::PersistentColumnData>
            (&PStack_68,deserializer,field_idx,field_name);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(this->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&PStack_68);
  ~PersistentColumnData(&PStack_68);
  SerializationData::Unset<duckdb::LogicalType>(&deserializer->data);
  return;
}

Assistant:

void PersistentColumnData::DeserializeField(Deserializer &deserializer, field_id_t field_idx, const char *field_name,
                                            const LogicalType &type) {
	deserializer.Set<const LogicalType &>(type);
	child_columns.push_back(deserializer.ReadProperty<PersistentColumnData>(field_idx, field_name));
	deserializer.Unset<LogicalType>();
}